

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSearchBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  LogicalTypeId LVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  pointer pEVar7;
  reference pvVar8;
  LogicalType *right;
  LogicalType *left;
  BinderException *this_01;
  LogicalType *type;
  allocator local_d1;
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  LogicalType max_child_type;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  local_b0 = (undefined1  [8])
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_d0,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_b0);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  uVar3 = local_d0._0_8_;
  local_d0._0_8_ = (_func_int **)0x0;
  _Var2._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_func_int **)local_d0._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_d0._0_8_ + 8))();
  }
  local_d0._0_8_ = (_func_int **)0x0;
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_b0 !=
      (Expression *)0x0) {
    (**(code **)(*(long *)local_b0 + 8))();
  }
  local_b0 = (undefined1  [8])0x0;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  right = &pEVar7->return_type;
  LVar1 = (pEVar7->return_type).id_;
  if ((pEVar6->return_type).id_ == UNKNOWN) {
    if (LVar1 == UNKNOWN) goto LAB_0148e96c;
    LogicalType::LIST((LogicalType *)local_d0,right);
    pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    LogicalType::operator=(pvVar8,(LogicalType *)local_d0);
    LogicalType::~LogicalType((LogicalType *)local_d0);
  }
  else {
    type = &pEVar6->return_type;
    if (LVar1 != UNKNOWN) {
      LogicalType::LogicalType(&max_child_type);
      left = ListType::GetChildType(type);
      bVar4 = LogicalType::TryGetMaxLogicalType(context,left,right,&max_child_type);
      if (!bVar4) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_d0,
                   "%s: Cannot match element of type \'%s\' in a list of type \'%s\' - an explicit cast is required"
                   ,&local_d1);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                    name);
        LogicalType::ToString_abi_cxx11_(&local_70,right);
        LogicalType::ToString_abi_cxx11_(&local_90,type);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_01,(string *)local_d0,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LIST((LogicalType *)local_d0,&max_child_type);
      this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
      pvVar8 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
      LogicalType::operator=(pvVar8,(LogicalType *)local_d0);
      LogicalType::~LogicalType((LogicalType *)local_d0);
      pvVar8 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
      LogicalType::operator=(pvVar8,&max_child_type);
      LogicalType::~LogicalType(&max_child_type);
      goto LAB_0148e96c;
    }
    pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    LogicalType::operator=(pvVar8,type);
    right = ListType::GetChildType(type);
  }
  pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,1);
  LogicalType::operator=(pvVar8,right);
LAB_0148e96c:
  make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
            ((duckdb *)local_d0,&(bound_function->super_BaseScalarFunction).return_type);
  *(undefined8 *)this = local_d0._0_8_;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSearchBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	// If the first argument is an array, cast it to a list
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	const auto &list = arguments[0]->return_type;
	const auto &value = arguments[1]->return_type;

	const auto list_is_param = list.id() == LogicalTypeId::UNKNOWN;
	const auto value_is_param = value.id() == LogicalTypeId::UNKNOWN;

	if (list_is_param) {
		if (!value_is_param) {
			// only list is a parameter, cast it to a list of value type
			bound_function.arguments[0] = LogicalType::LIST(value);
			bound_function.arguments[1] = value;
		}
	} else if (value_is_param) {
		// only value is a parameter: we expect the child type of list
		bound_function.arguments[0] = list;
		bound_function.arguments[1] = ListType::GetChildType(list);
	} else {
		LogicalType max_child_type;
		if (!LogicalType::TryGetMaxLogicalType(context, ListType::GetChildType(list), value, max_child_type)) {
			throw BinderException(
			    "%s: Cannot match element of type '%s' in a list of type '%s' - an explicit cast is required",
			    bound_function.name, value.ToString(), list.ToString());
		}

		bound_function.arguments[0] = LogicalType::LIST(max_child_type);
		bound_function.arguments[1] = max_child_type;
	}
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}